

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O1

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++:1014:17)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_xthread_test_c__:1014:17)>
             *this)

{
  MutexGuarded<kj::Maybe<kj::Own<kj::PromiseFulfiller<int>,_std::nullptr_t>_>_> *this_00;
  Disposer *pDVar1;
  PromiseFulfiller<int> *pPVar2;
  ReducePromises<int> node;
  Disposer *pDVar3;
  CrossThreadPromiseFulfiller<int> *pCVar4;
  Executor *this_01;
  PromiseCrossThreadFulfillerPair<int> paf;
  int result;
  WaitScope waitScope;
  EventLoop loop;
  UnixEventPort port;
  PromiseCrossThreadFulfillerPair<int> local_208;
  __pid_t local_1ec;
  char *local_1e8;
  char *pcStack_1e0;
  undefined8 local_1d8;
  EventLoop *local_1d0;
  undefined4 local_1c8;
  long local_1c0;
  undefined8 uStack_1b8;
  DebugComparison<int_&,_int> local_1b0;
  EventLoop local_188;
  UnixEventPort local_110;
  
  UnixEventPort::UnixEventPort(&local_110);
  EventLoop::EventLoop(&local_188,&local_110.super_EventPort);
  local_1c8 = 0xffffffff;
  local_1c0 = 0;
  uStack_1b8 = 0;
  local_1d0 = &local_188;
  EventLoop::enterScope(&local_188);
  this_01 = getCurrentThreadExecutor();
  Executor::newPromiseAndCrossThreadFulfiller<int>(&local_208,this_01);
  pCVar4 = local_208.fulfiller.ptr;
  pDVar3 = local_208.fulfiller.disposer;
  local_208.fulfiller.ptr = (CrossThreadPromiseFulfiller<int> *)0x0;
  this_00 = (this->f).fulfillerMutex;
  local_1b0.left = (int *)((ulong)local_1b0.left & 0xffffffffffffff00);
  kj::_::Mutex::lock(&this_00->mutex,0);
  pDVar1 = (this_00->value).ptr.disposer;
  pPVar2 = (this_00->value).ptr.ptr;
  (this_00->value).ptr.disposer = pDVar3;
  (this_00->value).ptr.ptr = &pCVar4->super_PromiseFulfiller<int>;
  if (pPVar2 != (PromiseFulfiller<int> *)0x0) {
    (**pDVar1->_vptr_Disposer)();
  }
  kj::_::Mutex::unlock(&this_00->mutex,EXCLUSIVE,(Waiter *)0x0);
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
  ;
  pcStack_1e0 = "operator()";
  local_1d8 = 0x12000003fc;
  local_1ec = Promise<int>::wait(&local_208.promise,&local_1d0);
  local_1b0.left = &local_1ec;
  local_1b0.right = 0x7b;
  local_1b0.op.content.ptr = " == ";
  local_1b0.op.content.size_ = 5;
  local_1b0.result = local_1ec == 0x7b;
  if ((!local_1b0.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31],kj::_::DebugComparison<int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
               ,0x3fd,ERROR,"\"failed: expected \" \"result == 123\", _kjCondition",
               (char (*) [31])"failed: expected result == 123",&local_1b0);
  }
  pCVar4 = local_208.fulfiller.ptr;
  if (local_208.fulfiller.ptr != (CrossThreadPromiseFulfiller<int> *)0x0) {
    local_208.fulfiller.ptr = (CrossThreadPromiseFulfiller<int> *)0x0;
    (**(local_208.fulfiller.disposer)->_vptr_Disposer)
              (local_208.fulfiller.disposer,
               (pCVar4->super_PromiseFulfiller<int>).super_PromiseRejector._vptr_PromiseRejector[-2]
               + (long)&(pCVar4->super_PromiseFulfiller<int>).super_PromiseRejector.
                        _vptr_PromiseRejector);
  }
  node.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)local_208.promise;
  if (local_208.promise.super_PromiseBase.node.ptr != (OwnPromiseNode)0x0) {
    local_208.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.super_PromiseBase.node.ptr);
  }
  if (local_1c0 == 0) {
    EventLoop::leaveScope(local_1d0);
  }
  EventLoop::~EventLoop(&local_188);
  UnixEventPort::~UnixEventPort(&local_110);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }